

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall
amrex::BaseFab<unsigned_int>::BaseFab(BaseFab<unsigned_int> *this,BaseFab<unsigned_int> *rhs)

{
  Arena *ar;
  DataAllocator *in_RSI;
  undefined8 *in_RDI;
  
  ar = DataAllocator::arena(in_RSI);
  DataAllocator::DataAllocator((DataAllocator *)(in_RDI + 1),ar);
  *in_RDI = &PTR__BaseFab_01801d48;
  in_RDI[2] = in_RSI[2].m_arena;
  in_RDI[3] = in_RSI[3].m_arena;
  in_RDI[4] = in_RSI[4].m_arena;
  in_RDI[5] = in_RSI[5].m_arena;
  *(undefined4 *)(in_RDI + 6) = *(undefined4 *)&in_RSI[6].m_arena;
  *(undefined4 *)((long)in_RDI + 0x34) = *(undefined4 *)((long)&in_RSI[6].m_arena + 4);
  in_RDI[7] = in_RSI[7].m_arena;
  *(byte *)(in_RDI + 8) = *(byte *)&in_RSI[8].m_arena & 1;
  *(byte *)((long)in_RDI + 0x41) = *(byte *)((long)&in_RSI[8].m_arena + 1) & 1;
  in_RSI[2].m_arena = (Arena *)0x0;
  *(undefined1 *)&in_RSI[8].m_arena = 0;
  return;
}

Assistant:

BaseFab<T>::BaseFab (BaseFab<T>&& rhs) noexcept
    : DataAllocator{rhs.arena()},
      dptr(rhs.dptr), domain(rhs.domain),
      nvar(rhs.nvar), truesize(rhs.truesize),
      ptr_owner(rhs.ptr_owner), shared_memory(rhs.shared_memory)
{
    rhs.dptr = nullptr;
    rhs.ptr_owner = false;
}